

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcfs.c
# Opt level: O0

void arcfs_fixtime(Header *hdr)

{
  tm *ptVar1;
  tm *tim;
  Header *hdr_local;
  
  ptVar1 = rotm(hdr->load,hdr->exec);
  hdr->date = ((short)ptVar1->tm_year + -0x50) * 0x200;
  hdr->date = hdr->date | ((short)ptVar1->tm_mon + 1) * 0x20;
  hdr->date = hdr->date | (ushort)ptVar1->tm_mday;
  hdr->time = (Halfword)(ptVar1->tm_hour << 0xb);
  hdr->time = hdr->time | (ushort)(ptVar1->tm_min << 5);
  hdr->time = hdr->time | (ushort)(ptVar1->tm_sec / 2);
  return;
}

Assistant:

void
arcfs_fixtime(Header *hdr)
{
	/* BB next line commented out, variable ti never used */
	/* time_t ti; */
	struct tm *tim;

	/* Convert to UNIX time first (as it is easy) */
	tim = rotm(hdr->load, hdr->exec);

	/* Convert UNIX time to SPARK time */
	hdr->date = (tim->tm_year - 80) << 9;
	hdr->date |= (tim->tm_mon + 1) << 5;
	hdr->date |= (tim->tm_mday);
	hdr->time = (tim->tm_hour) << 11;
	hdr->time |= (tim->tm_min) << 5;
	hdr->time |= tim->tm_sec / 2;
}